

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.cpp
# Opt level: O3

bool duckdb::TryCastFromDecimal::Operation<long,long>
               (int64_t input,int64_t *result,CastParameters *parameters,uint8_t width,uint8_t scale
               )

{
  undefined3 in_register_00000081;
  
  *result = ((long)((input >> 0x3f ^
                    *(ulong *)(NumericHelper::POWERS_OF_TEN +
                              (ulong)CONCAT31(in_register_00000081,scale) * 8)) - (input >> 0x3f)) /
             2 + input) /
            (long)*(ulong *)(NumericHelper::POWERS_OF_TEN +
                            (ulong)CONCAT31(in_register_00000081,scale) * 8);
  return true;
}

Assistant:

bool TryCastDecimalToNumeric(SRC input, DST &result, CastParameters &parameters, uint8_t scale) {
	// Round away from 0.
	const auto power = NumericHelper::POWERS_OF_TEN[scale];
	// https://graphics.stanford.edu/~seander/bithacks.html#ConditionalNegate
	const auto fNegate = int64_t(input < 0);
	const auto rounding = ((power ^ -fNegate) + fNegate) / 2;
	const auto scaled_value = (input + rounding) / power;
	if (!TryCast::Operation<SRC, DST>(UnsafeNumericCast<SRC>(scaled_value), result)) {
		string error = StringUtil::Format("Failed to cast decimal value %d to type %s", scaled_value, GetTypeId<DST>());
		HandleCastError::AssignError(error, parameters);
		return false;
	}
	return true;
}